

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_circuit.cpp
# Opt level: O3

void __thiscall lsim::ModelCircuit::sync_sub_circuit_components(ModelCircuit *this)

{
  iterator iVar1;
  pointer puVar2;
  uint local_4c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  component_ids_of_type(&local_48,this,0x301);
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    puVar2 = local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      local_4c = *puVar2;
      iVar1 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->m_components)._M_h,&local_4c);
      ModelComponent::sync_nested_circuit
                (*(ModelComponent **)
                  ((long)iVar1.
                         super__Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>_>,_false>
                         ._M_cur + 0x10),this->m_context);
      puVar2 = puVar2 + 1;
    } while (puVar2 != local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ModelCircuit::sync_sub_circuit_components() {
    for (auto id : component_ids_of_type(COMPONENT_SUB_CIRCUIT)) {
        auto comp = component_by_id(id);
        comp->sync_nested_circuit(m_context);
    }
}